

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O3

int __thiscall
kstream<gzFile_s_*,_FunctorZlib>::getuntil
          (kstream<gzFile_s_*,_FunctorZlib> *this,Delimiter delimiter,string *str,int *dret)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  
  if (dret != (int *)0x0) {
    *dret = 0;
  }
  if (str->_M_string_length != 0) {
    str->_M_string_length = 0;
    *(str->_M_dataplus)._M_p = '\0';
  }
  iVar2 = this->begin;
  uVar1 = this->end;
  if ((iVar2 < (int)uVar1) || (iVar3 = -1, this->is_eof == 0)) {
    do {
      if ((int)uVar1 <= iVar2) {
        if (this->is_eof != 0) break;
        this->begin = 0;
        uVar1 = gzread(this->f,this->buf,this->bufferSize);
        this->end = uVar1;
        if (uVar1 < this->bufferSize) {
          this->is_eof = 1;
        }
        if (uVar1 == 0) break;
      }
      if (delimiter == EOL) {
        uVar8 = this->begin;
        pcVar7 = this->buf;
        uVar5 = uVar8;
        if ((int)uVar8 < (int)uVar1) {
          pcVar6 = pcVar7 + (int)uVar8;
          uVar4 = uVar8;
          do {
            uVar5 = uVar4;
            if (*pcVar6 == '\n') break;
            uVar4 = uVar4 + 1;
            pcVar6 = pcVar6 + 1;
            uVar5 = uVar1;
          } while (uVar1 != uVar4);
        }
      }
      else if (delimiter == SPACE) {
        uVar8 = this->begin;
        pcVar7 = this->buf;
        uVar5 = uVar8;
        if ((int)uVar8 < (int)uVar1) {
          pcVar6 = pcVar7 + (int)uVar8;
          uVar4 = uVar8;
          do {
            iVar2 = isspace((int)*pcVar6);
            uVar5 = uVar4;
            if (iVar2 != 0) break;
            uVar4 = uVar4 + 1;
            pcVar6 = pcVar6 + 1;
            uVar5 = uVar1;
          } while (uVar1 != uVar4);
        }
      }
      else {
        pcVar7 = this->buf;
        uVar8 = this->begin;
        uVar5 = 0;
      }
      std::__cxx11::string::append((char *)str,(ulong)(pcVar7 + (int)uVar8));
      iVar2 = uVar5 + 1;
      this->begin = iVar2;
      uVar1 = this->end;
      if ((dret != (int *)0x0) && ((int)uVar5 < (int)uVar1)) {
        *dret = (int)this->buf[(int)uVar5];
        break;
      }
    } while ((int)uVar1 <= (int)uVar5);
    iVar3 = (int)str->_M_string_length;
  }
  return iVar3;
}

Assistant:

int getuntil(Delimiter delimiter, std::string &str, int *dret)
    {
        if (dret)
            *dret = 0;
        if (!str.empty()) {
            str.clear();
        }

        if (this->begin >= this->end && this->is_eof)
            return -1;
        for (;;)
        {
            int i;
            if (this->begin >= this->end)
            {
                if (!this->is_eof)
                {
                    this->begin = 0;
                    this->end = this->readfunc(this->f, this->buf, bufferSize);
                    if (this->end < bufferSize)
                        this->is_eof = 1;
                    if (this->end == 0)
                        break;
                }
                else
                    break;
            }
            if (delimiter == EOL)
            {
                for (i = this->begin; i < this->end; ++i)
                {
                    if (this->buf[i] == '\n')
                        break;
                }
            }
            else if (delimiter == SPACE)
            {
                for (i = this->begin; i < this->end; ++i)
                {
                    if (isspace(this->buf[i]))
                        break;
                }
            }
            else i = 0;

            str.append(this->buf + this->begin, static_cast<unsigned long>(i - this->begin));
            this->begin = i + 1;
            if (i < this->end)
            {
                if (dret)
                    *dret = this->buf[i];
                break;
            }
        }
        return (int)str.length();
    }